

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinDiff.cc
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  __type _Var2;
  int iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  unsigned_long context_lines;
  unsigned_long base_offset;
  FILE *f;
  FILE *f_00;
  bool use_color;
  string data2;
  string data1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> filename2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> filename1;
  Arguments args;
  
  phosg::Arguments::Arguments(&args,argv,(long)argc);
  bVar1 = phosg::Arguments::get<bool>(&args,"help");
  if (bVar1) {
    print_usage();
  }
  else {
    pbVar4 = phosg::Arguments::
             get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       (&args,1,true);
    std::__cxx11::string::string((string *)&filename1,pbVar4);
    pbVar4 = phosg::Arguments::
             get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       (&args,2,true);
    std::__cxx11::string::string((string *)&filename2,pbVar4);
    _Var2 = std::operator==(&filename1,&filename2);
    if (!_Var2) {
      bVar1 = phosg::Arguments::get<bool>(&args,"no-color");
      if (bVar1) {
        use_color = false;
      }
      else {
        bVar1 = phosg::Arguments::get<bool>(&args,"color");
        use_color = true;
        if (!bVar1) {
          iVar3 = fileno(_stdout);
          iVar3 = isatty(iVar3);
          use_color = iVar3 != 0;
        }
      }
      context_lines =
           phosg::Arguments::get<unsigned_long,_char[8]>(&args,(char (*) [8])0x118074,3,DEFAULT);
      base_offset = phosg::Arguments::get<unsigned_long,_char[14]>
                              (&args,(char (*) [14])"start-address",0,HEX);
      bVar1 = std::operator==(&filename1,"-");
      if (bVar1) {
        phosg::read_all_abi_cxx11_((string *)&data1,_stdin,f);
      }
      else {
        phosg::load_file((string *)&data1,(string *)&filename1);
      }
      bVar1 = std::operator==(&filename2,"-");
      if (bVar1) {
        phosg::read_all_abi_cxx11_((string *)&data2,_stdin,f_00);
      }
      else {
        phosg::load_file((string *)&data2,(string *)&filename2);
      }
      print_binary_diff((FILE *)_stdout,data1._M_dataplus._M_p,data1._M_string_length,
                        data2._M_dataplus._M_p,data2._M_string_length,use_color,context_lines,
                        base_offset);
      std::__cxx11::string::~string((string *)&data2);
      std::__cxx11::string::~string((string *)&data1);
    }
    std::__cxx11::string::~string((string *)&filename2);
    std::__cxx11::string::~string((string *)&filename1);
  }
  phosg::Arguments::~Arguments(&args);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  Arguments args(argv, argc);
  if (args.get<bool>("help")) {
    print_usage();
    return 0;
  }

  auto filename1 = args.get<string>(1);
  auto filename2 = args.get<string>(2);
  if (filename1 == filename2) {
    return 0;
  }

  bool use_color;
  if (args.get<bool>("no-color")) {
    use_color = false;
  } else if (args.get<bool>("color")) {
    use_color = true;
  } else {
    use_color = isatty(fileno(stdout));
  }
  size_t context_lines = args.get<size_t>("context", 3);
  uint64_t base_offset = args.get<uint64_t>("start-address", 0, phosg::Arguments::IntFormat::HEX);

  string data1 = (filename1 == "-") ? read_all(stdin) : load_file(filename1);
  string data2 = (filename2 == "-") ? read_all(stdin) : load_file(filename2);

  print_binary_diff(stdout, data1.data(), data1.size(), data2.data(), data2.size(), use_color, context_lines, base_offset);
  return 0;
}